

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O0

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::TetrahedralMesh(TPZAcademicGeoMesh *this)

{
  _func_int **pp_Var1;
  TPZGeoMesh *pTVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_RDI;
  int il;
  int64_t index;
  TPZManVector<long,_4> elnodes;
  int el;
  TPZManVector<long,_8> nodes;
  int64_t k;
  int64_t j;
  int64_t i;
  TPZGeoMesh *gmesh;
  int MaterialId;
  int64_t nelem;
  TPZGeoMesh *in_stack_00000328;
  TPZAcademicGeoMesh *in_stack_00000330;
  TPZManVector<long,_8> *in_stack_fffffffffffffe50;
  TPZManVector<long,_4> *in_stack_fffffffffffffe70;
  long *in_stack_fffffffffffffe78;
  TPZGeoMesh *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar9;
  TPZAcademicGeoMesh *in_stack_ffffffffffffff00;
  TPZVec<long> local_f8;
  TPZGeoMesh *in_stack_ffffffffffffff38;
  TPZAcademicGeoMesh *in_stack_ffffffffffffff40;
  int local_b4;
  TPZVec<long> local_a8 [3];
  long local_48;
  long local_40;
  long local_38;
  TPZGeoMesh *local_20;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x2f0);
  local_14 = *(uint *)(in_RDI + 0x2f8);
  pTVar2 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffffe80);
  local_20 = pTVar2;
  GenerateNodes(in_stack_ffffffffffffff00,
                (TPZGeoMesh *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  TPZGeoMesh::SetDimension(local_20,3);
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    for (local_40 = 0; local_40 < local_10; local_40 = local_40 + 1) {
      for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
        TPZManVector<long,_8>::TPZManVector
                  ((TPZManVector<long,_8> *)in_stack_fffffffffffffe80,
                   (int64_t)in_stack_fffffffffffffe78,(long *)in_stack_fffffffffffffe70);
        lVar7 = local_10 + 1;
        lVar7 = local_48 * lVar7 * lVar7 + local_40 * lVar7 + local_38;
        plVar3 = TPZVec<long>::operator[](local_a8,0);
        *plVar3 = lVar7;
        lVar8 = local_10 + 1;
        lVar6 = local_48 * lVar8;
        lVar4 = local_40 * lVar8;
        lVar7 = local_38 + 1;
        plVar3 = TPZVec<long>::operator[](local_a8,1);
        *plVar3 = lVar7 + lVar6 * lVar8 + lVar4;
        lVar8 = local_10 + 1;
        lVar6 = local_48 * lVar8;
        lVar4 = local_40 + 1;
        lVar7 = local_38 + 1;
        plVar3 = TPZVec<long>::operator[](local_a8,2);
        *plVar3 = lVar7 + lVar6 * lVar8 + lVar4 * lVar8;
        lVar7 = local_10 + 1;
        lVar7 = local_48 * lVar7 * lVar7 + (local_40 + 1) * lVar7 + local_38;
        plVar3 = TPZVec<long>::operator[](local_a8,3);
        *plVar3 = lVar7;
        lVar7 = local_10 + 1;
        lVar7 = (local_48 + 1) * lVar7 * lVar7 + local_40 * lVar7 + local_38;
        plVar3 = TPZVec<long>::operator[](local_a8,4);
        *plVar3 = lVar7;
        lVar7 = local_10 + 1;
        in_stack_fffffffffffffe80 =
             (TPZGeoMesh *)(local_38 + 1 + (local_48 + 1) * lVar7 * lVar7 + local_40 * lVar7);
        plVar3 = TPZVec<long>::operator[](local_a8,5);
        *plVar3 = (long)in_stack_fffffffffffffe80;
        lVar7 = local_10 + 1;
        in_stack_fffffffffffffe70 =
             (TPZManVector<long,_4> *)
             (local_38 + 1 + (local_48 + 1) * lVar7 * lVar7 + (local_40 + 1) * lVar7);
        in_stack_fffffffffffffe78 = TPZVec<long>::operator[](local_a8,6);
        *in_stack_fffffffffffffe78 = (long)in_stack_fffffffffffffe70;
        lVar7 = local_10 + 1;
        lVar7 = (local_48 + 1) * lVar7 * lVar7 + (local_40 + 1) * lVar7 + local_38;
        plVar3 = TPZVec<long>::operator[](local_a8,7);
        *plVar3 = lVar7;
        for (local_b4 = 0; local_b4 < 6; local_b4 = local_b4 + 1) {
          TPZManVector<long,_4>::TPZManVector(in_stack_fffffffffffffe70,(int64_t)plVar3);
          for (iVar9 = 0; iVar9 < 4; iVar9 = iVar9 + 1) {
            plVar5 = TPZVec<long>::operator[](local_a8,(long)tetraedra_2[local_b4][iVar9]);
            pp_Var1 = (_func_int **)*plVar5;
            in_stack_fffffffffffffe50 =
                 (TPZManVector<long,_8> *)TPZVec<long>::operator[](&local_f8,(long)iVar9);
            (in_stack_fffffffffffffe50->super_TPZVec<long>)._vptr_TPZVec = pp_Var1;
          }
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,4,&local_f8,(ulong)local_14,&stack0xffffffffffffff00,1);
          TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffe50);
        }
        TPZManVector<long,_8>::~TPZManVector(in_stack_fffffffffffffe50);
      }
    }
  }
  TPZGeoMesh::BuildConnectivity((TPZGeoMesh *)k);
  AddBoundaryElements(in_stack_00000330,in_stack_00000328);
  if ((*(byte *)(in_RDI + 0x2e8) & 1) != 0) {
    DeformGMesh(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return local_20;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::TetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<6; el++)
                {
                    TPZManVector<int64_t,4> elnodes(4);
                    int64_t index;
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra_2[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}